

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg.h
# Opt level: O1

object * ocmesh::details::scale(object *node,float factor)

{
  length_t i;
  long lVar1;
  transform_t *ptVar2;
  byte bVar3;
  tvec3<bool,_(glm::precision)0> Result;
  tmat4x4<float,_(glm::precision)0> Result_1;
  byte abStack_5f [3];
  float local_5c [3];
  object *local_50;
  tmat4x4<float,_(glm::precision)0> local_48;
  
  if ((factor == 0.0) && (!NAN(factor))) {
    __assert_fail("factor != 0 && \"Scaling factor must be non-zero\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nicola-gigante[P]ocmesh/include/csg.h"
                  ,0x183,"object *ocmesh::details::scale(object *, float)");
  }
  local_5c[0] = factor;
  local_5c[1] = factor;
  local_5c[2] = factor;
  local_48.value[0].field_0 = (anon_union_4_3_4e90da17_for_tvec4<float,_(glm::precision)0>_2)0x0;
  local_48.value[0].field_1 = (anon_union_4_3_4e90b0ec_for_tvec4<float,_(glm::precision)0>_4)0x0;
  local_48.value[0].field_2.z = 0.0;
  lVar1 = 0;
  do {
    abStack_5f[lVar1] = local_5c[lVar1] != (&local_48.value[0].field_0)[lVar1].x;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  bVar3 = 1;
  lVar1 = 0;
  do {
    if ((bVar3 & 1) == 0) {
      bVar3 = 0;
    }
    else {
      bVar3 = abStack_5f[lVar1];
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (bVar3 != 0) {
    local_48.value[0].field_2.z = factor * 0.0;
    local_48.value[0].field_1.y = local_48.value[0].field_2.z;
    local_48.value[0].field_0.x = factor;
    local_48.value[3].field_0 = (anon_union_4_3_4e90da17_for_tvec4<float,_(glm::precision)0>_2)0x0;
    local_48.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_tvec4<float,_(glm::precision)0>_4)0x0;
    local_48.value[3].field_2 = (anon_union_4_3_4e909dac_for_tvec4<float,_(glm::precision)0>_6)0x0;
    local_48.value[3].field_3 =
         (anon_union_4_3_4e909a07_for_tvec4<float,_(glm::precision)0>_8)0x3f800000;
    local_50 = node;
    local_48.value[0].field_3.w = local_48.value[0].field_2.z;
    local_48.value[1].field_0.x = local_48.value[0].field_2.z;
    local_48.value[1].field_1.y = factor;
    local_48.value[1].field_2 = local_48.value[0].field_2;
    local_48.value[1].field_3.w = local_48.value[0].field_2.z;
    local_48.value[2].field_0.x = local_48.value[0].field_2.z;
    local_48.value[2].field_1.y = local_48.value[0].field_2.z;
    local_48.value[2].field_2.z = factor;
    local_48.value[2].field_3.w = local_48.value[0].field_2.z;
    ptVar2 = scene::
             make<ocmesh::details::transform_t,_ocmesh::details::object_*&,_const_glm::tmat4x4<float,_(glm::precision)0>_&,_void,_0>
                       (node->_scene,&local_50,&local_48);
    return &ptVar2->super_object;
  }
  __assert_fail("glm::all(glm::notEqual(factors, {})) && \"Scaling factor components must be non-zero\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nicola-gigante[P]ocmesh/include/csg.h"
                ,0x17e,"object *ocmesh::details::scale(object *, const glm::vec3 &)");
}

Assistant:

inline object *scale(object *node, float factor) {
        assert(factor != 0 && "Scaling factor must be non-zero");
        return scale(node, { factor, factor, factor });
    }